

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

NoopStatement * __thiscall
soul::PoolAllocator::allocate<soul::AST::NoopStatement,soul::AST::Context>
          (PoolAllocator *this,Context *args)

{
  DestructorFn *pDVar1;
  void **this_00;
  _lambda_void___1_ local_29;
  void **local_28;
  NoopStatement *newObject;
  PoolItem *newItem;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args;
  args_local = (Context *)this;
  newObject = (NoopStatement *)allocateSpaceForObject(this,0x28);
  this_00 = &((PoolItem *)newObject)->item;
  AST::NoopStatement::NoopStatement((NoopStatement *)this_00,(Context *)newItem);
  local_28 = this_00;
  pDVar1 = allocate(soul::AST::Context&&)::{lambda(void*)#1}::operator_cast_to_function_pointer
                     (&local_29);
  *(DestructorFn **)&(newObject->super_Statement).super_ASTObject.objectType = pDVar1;
  return (NoopStatement *)local_28;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }